

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

void __thiscall IR::Instr::DumpRange(Instr *this,Instr *instrEnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  Instr *pIVar5;
  
  pIVar5 = (Instr *)0x0;
  Output::Print(L"-------------------------------------------------------------------------------\n"
               );
  if (instrEnd != (Instr *)0x0) {
    pIVar5 = instrEnd->m_next;
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pIVar4 = (Instr *)0x0;
  do {
    if (this == pIVar5) {
      Output::Print(
                   L"-------------------------------------------------------------------------------\n"
                   );
      return;
    }
    if ((pIVar4 != (Instr *)0x0) && (pIVar4->m_next != this)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x1320,
                         "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    (**this->_vptr_Instr)(this,0);
    pIVar4 = this;
    this = this->m_next;
  } while( true );
}

Assistant:

void
Instr::DumpRange(Instr *instrEnd)
{
    Output::Print(_u("-------------------------------------------------------------------------------\n"));

    FOREACH_INSTR_IN_RANGE(instr, this, instrEnd)
    {
        instr->Dump();
    }
    NEXT_INSTR_IN_RANGE;

    Output::Print(_u("-------------------------------------------------------------------------------\n"));
}